

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.h
# Opt level: O2

size_t __thiscall
embree::FastAllocator::Block::getWastedBytes(Block *this,AllocationType atype,bool huge_pages)

{
  bool bVar1;
  Block *block;
  size_t sVar2;
  
  sVar2 = 0;
  for (; this != (Block *)0x0; this = this->next) {
    bVar1 = hasType(this,atype,huge_pages);
    if (bVar1) {
      sVar2 = sVar2 + this->wasted + 0x40;
    }
  }
  return sVar2;
}

Assistant:

size_t getWastedBytes(AllocationType atype, bool huge_pages = false) const {
        size_t bytes = 0;
        for (const Block* block = this; block; block = block->next) {
          if (!block->hasType(atype,huge_pages)) continue;
          bytes += block->getBlockWastedBytes();
        }
        return bytes;
      }